

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

int fprint<int&>(FILE *out,char *fmt,int *args)

{
  size_t sVar1;
  string str;
  
  stringformat<int&>(&str,fmt,args);
  sVar1 = fwrite(str._M_dataplus._M_p,str._M_string_length,1,(FILE *)out);
  std::__cxx11::string::~string((string *)&str);
  return (int)sVar1;
}

Assistant:

int fprint(FILE *out, const char *fmt, ARGS&&...args)
{
    auto str = stringformat(fmt, std::forward<ARGS>(args)...);
    return fwrite(str.c_str(), str.size(), 1, out);
}